

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max,ImGuiSliderFlags flags)

{
  bool bVar1;
  int iVar2;
  float v_speed_00;
  ImGuiWindow *pIVar3;
  int in_ECX;
  int *in_RDX;
  float *in_RSI;
  char *in_RDI;
  int in_R8D;
  char *in_R9;
  int in_XMM0_Da;
  char *in_stack_00000008;
  ImGuiSliderFlags max_flags;
  int max_max;
  int max_min;
  bool value_changed;
  ImGuiSliderFlags min_flags;
  int min_max;
  int min_min;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_00000094;
  char *in_stack_00000098;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiSliderFlags flags_00;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int v_max_00;
  int in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  bool local_1;
  
  flags_00 = (ImGuiSliderFlags)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  v_max_00 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    PushID((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    BeginGroup();
    CalcItemWidth();
    PushMultiItemsWidths(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    if (in_ECX < in_R8D) {
      iVar2 = ImMin<int>(in_R8D,*in_RDX);
    }
    else {
      iVar2 = *in_RDX;
    }
    local_1 = DragInt((char *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,v_max_00,
                      in_stack_ffffffffffffff70,flags_00);
    PopItemWidth();
    SameLine((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),SUB84(in_stack_ffffffffffffff70,0));
    if (in_ECX < in_R8D) {
      v_speed_00 = (float)ImMax<int>(in_ECX,(int)*in_RSI);
    }
    else {
      v_speed_00 = *in_RSI;
      in_R8D = 0x7fffffff;
    }
    if (in_stack_00000008 != (char *)0x0) {
      in_R9 = in_stack_00000008;
    }
    bVar1 = DragInt((char *)CONCAT44(iVar2,v_speed_00),(int *)CONCAT44(in_R8D,in_R8D),v_speed_00,
                    in_XMM0_Da,(int)((ulong)in_RDX >> 0x20),in_R9,flags_00);
    local_1 = local_1 || bVar1;
    PopItemWidth();
    SameLine((float)((ulong)in_R9 >> 0x20),SUB84(in_R9,0));
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextEx(format_max,in_stack_00000098,in_stack_00000094);
    EndGroup();
    PopID();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragIntRange2(const char* label, int* v_current_min, int* v_current_max, float v_speed, int v_min, int v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    int min_min = (v_min >= v_max) ? INT_MIN : v_min;
    int min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragInt("##min", v_current_min, v_speed, min_min, min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    int max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    int max_max = (v_min >= v_max) ? INT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragInt("##max", v_current_max, v_speed, max_min, max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}